

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

nk_flags nk_chart_push_slot(nk_context *ctx,float value,int slot)

{
  nk_vec2 nVar1;
  int iVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  void *pvVar5;
  nk_command_buffer *b;
  nk_flags nVar6;
  nk_flags nVar7;
  uint uVar8;
  nk_chart_slot *pnVar9;
  nk_color nVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  float local_48;
  float fStack_44;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5dd3,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  pnVar3 = ctx->current;
  if (pnVar3 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5dd4,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  if (3 < (uint)slot) {
    __assert_fail("slot >= 0 && slot < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                  ,0x5dd5,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
  }
  pnVar4 = pnVar3->layout;
  if (slot < (pnVar4->chart).slot) {
    pnVar9 = (pnVar4->chart).slots + (uint)slot;
    if (pnVar9->type == NK_CHART_COLUMN) {
      iVar2 = pnVar9->count;
      if (iVar2 <= pnVar9->index) {
        return 0;
      }
      if (iVar2 == 0) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = ((pnVar4->chart).w - (float)(iVar2 + -1)) / (float)iVar2;
      }
      fVar16 = (pnVar4->chart).h;
      fVar12 = pnVar9->range;
      fVar14 = value / fVar12;
      fVar15 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar15 = fVar14;
      }
      fVar15 = fVar15 * fVar16;
      if (0.0 <= value) {
        fVar14 = pnVar9->min;
        fVar17 = -fVar14;
        if (-fVar14 <= fVar14) {
          fVar17 = fVar14;
        }
        fVar14 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar14 = fVar12;
        }
        fVar16 = ((pnVar4->chart).y + fVar16) - ((fVar17 + value) / fVar14) * fVar16;
      }
      else {
        fVar12 = (value - pnVar9->max) / fVar12;
        fVar14 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar14 = fVar12;
        }
        fVar16 = (fVar16 * fVar14 + (pnVar4->chart).y) - fVar15;
      }
      fVar12 = (float)pnVar9->index;
      nVar10 = pnVar9->color;
      rect_00.h = fVar15;
      rect_00.w = fVar11;
      fVar12 = fVar12 * fVar11 + (pnVar4->chart).x + fVar12;
      rect_00.y = fVar16;
      rect_00.x = fVar12;
      nVar7 = 0;
      nVar6 = 0;
      if (((((pnVar4->flags & 0x1000) == 0) && (fVar14 = (ctx->input).mouse.pos.x, fVar12 <= fVar14)
           ) && (nVar6 = nVar7, fVar14 < fVar11 + fVar12)) &&
         ((fVar11 = (ctx->input).mouse.pos.y, fVar16 <= fVar11 && (fVar11 < fVar15 + fVar16)))) {
        nVar6 = 1;
        if ((ctx->input).mouse.buttons[0].down == 0) {
          nVar6 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
        }
        nVar10 = pnVar9->highlight;
      }
      nk_fill_rect(&pnVar3->buffer,rect_00,0.0,nVar10);
    }
    else {
      if (pnVar9->type != NK_CHART_LINES) {
        return 0;
      }
      b = &pnVar3->buffer;
      fVar11 = (value - pnVar9->min) / (pnVar9->max - pnVar9->min);
      if (pnVar9->index == 0) {
        fVar16 = (pnVar4->chart).x;
        (pnVar9->last).x = fVar16;
        fVar12 = (pnVar4->chart).h;
        fVar11 = ((pnVar4->chart).y + fVar12) - fVar11 * fVar12;
        (pnVar9->last).y = fVar11;
        rect_01.x = fVar16 + -2.0;
        rect_01.y = fVar11 + -2.0;
        nVar10 = pnVar9->color;
        nVar7 = 0;
        nVar6 = 0;
        if ((pnVar4->flags & 0x1000) == 0) {
          fVar12 = (ctx->input).mouse.pos.x;
          if ((fVar16 + -3.0 <= fVar12) && (nVar6 = nVar7, fVar12 < fVar16 + -3.0 + 6.0)) {
            fVar16 = (ctx->input).mouse.pos.y;
            if ((fVar11 + -3.0 <= fVar16) && (fVar16 < fVar11 + -3.0 + 6.0)) {
              if ((ctx->input).mouse.buttons[0].down == 0) {
                uVar8 = 0;
              }
              else {
                uVar8 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2;
              }
              nVar6 = uVar8 | -(uint)((fVar12 < rect_01.x + 4.0 && rect_01.x <= fVar12) &&
                                     (fVar16 < rect_01.y + 4.0 && rect_01.y <= fVar16)) & 1;
              nVar10 = pnVar9->highlight;
            }
          }
        }
        rect_01.w = 4.0;
        rect_01.h = 4.0;
        nk_fill_rect(b,rect_01,0.0,nVar10);
      }
      else {
        nVar10 = pnVar9->color;
        fVar16 = (pnVar4->chart).h;
        fVar12 = (pnVar4->chart).x +
                 (float)pnVar9->index * ((pnVar4->chart).w / (float)pnVar9->count);
        fVar11 = (pnVar4->chart).y + fVar16 + fVar16 * -fVar11;
        nVar1 = pnVar9->last;
        pvVar5 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
        if (pvVar5 != (void *)0x0) {
          *(undefined2 *)((long)pvVar5 + 0x10) = 1;
          local_48 = nVar1.x;
          fStack_44 = nVar1.y;
          auVar13._0_4_ = (int)local_48;
          auVar13._4_4_ = (int)fStack_44;
          auVar13._8_4_ = (int)fVar12;
          auVar13._12_4_ = (int)fVar11;
          auVar13 = packssdw(auVar13,auVar13);
          *(long *)((long)pvVar5 + 0x12) = auVar13._0_8_;
          *(nk_color *)((long)pvVar5 + 0x1a) = nVar10;
        }
        nVar7 = 0;
        nVar6 = 0;
        if ((pnVar4->flags & 0x1000) == 0) {
          fVar16 = (ctx->input).mouse.pos.x;
          nVar6 = nVar7;
          if ((fVar12 + -3.0 <= fVar16) && (fVar16 < fVar12 + -3.0 + 6.0)) {
            fVar16 = (ctx->input).mouse.pos.y;
            if ((fVar11 + -3.0 <= fVar16) && (fVar16 < fVar11 + -3.0 + 6.0)) {
              nVar6 = 1;
              if ((ctx->input).mouse.buttons[0].down == 0) {
                nVar6 = (uint)((ctx->input).mouse.buttons[0].clicked != 0) * 2 + 1;
              }
              nVar10 = pnVar9->highlight;
            }
          }
        }
        rect.x = fVar12 + -2.0;
        rect.y = fVar11 + -2.0;
        rect.w = 4.0;
        rect.h = 4.0;
        nk_fill_rect(b,rect,0.0,nVar10);
        nVar1.y = fVar11;
        nVar1.x = fVar12;
        pnVar9->last = nVar1;
      }
    }
    pnVar9->index = pnVar9->index + 1;
    return nVar6;
  }
  __assert_fail("slot < ctx->current->layout->chart.slot",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/external/glfw/deps/nuklear.h"
                ,0x5dd6,"nk_flags nk_chart_push_slot(struct nk_context *, float, int)");
}

Assistant:

NK_API nk_flags
nk_chart_push_slot(struct nk_context *ctx, float value, int slot)
{
    nk_flags flags;
    struct nk_window *win;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(slot >= 0 && slot < NK_CHART_MAX_SLOT);
    NK_ASSERT(slot < ctx->current->layout->chart.slot);
    if (!ctx || !ctx->current || slot >= NK_CHART_MAX_SLOT) return nk_false;
    if (slot >= ctx->current->layout->chart.slot) return nk_false;

    win = ctx->current;
    if (win->layout->chart.slot < slot) return nk_false;
    switch (win->layout->chart.slots[slot].type) {
    case NK_CHART_LINES:
        flags = nk_chart_push_line(ctx, win, &win->layout->chart, value, slot); break;
    case NK_CHART_COLUMN:
        flags = nk_chart_push_column(ctx, win, &win->layout->chart, value, slot); break;
    default:
    case NK_CHART_MAX:
        flags = 0;
    }
    return flags;
}